

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  uint8_t typecode;
  ushort uVar1;
  undefined8 *c;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  container_t *c_00;
  bitset_container_t *c1;
  ulong uVar5;
  bitset_container_t *pbVar6;
  ushort *puVar7;
  undefined7 in_register_00000011;
  int start_index;
  long lVar8;
  undefined8 *c_01;
  uint uVar9;
  int iVar10;
  uint8_t typecode_00;
  uint16_t key;
  uint8_t type1;
  uint8_t type2;
  uint8_t result_type;
  roaring_array_t *local_88;
  int local_7c;
  ulong local_78;
  ulong local_70;
  undefined4 local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  result_type = '\0';
  local_7c = (x2->high_low_container).size;
  if (local_7c == 0) {
    return;
  }
  uVar9 = (x1->high_low_container).size;
  if (uVar9 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  local_64 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
  puVar7 = (x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  local_60 = (ulong)(1 - local_7c);
  local_50 = 0;
  uVar5 = 0;
  local_88 = &x1->high_low_container;
  do {
    local_78 = (ulong)uVar9;
    uVar1 = *puVar7;
    local_58 = local_50 & 0xffffffff;
    local_38 = local_60 + local_58;
    local_40 = (long)(int)local_50;
    local_48 = local_40 * 8;
    local_70 = uVar5 & 0xffffffff;
    lVar8 = 0;
    while( true ) {
      uVar5 = local_58 + lVar8;
      iVar10 = (int)local_70;
      iVar2 = (int)lVar8;
      if (uVar1 == key) break;
      if (uVar1 < key) {
        uVar5 = local_70 + lVar8 + 1;
        iVar10 = (int)local_78;
        if (iVar10 + iVar2 == (uint)uVar5) {
          start_index = iVar2 + (int)local_58;
          goto LAB_0011d101;
        }
        puVar7 = (ushort *)((ulong)(((uint)uVar5 & 0xffff) * 2) + (long)local_88->keys);
        local_50 = (ulong)(uint)((int)local_58 + iVar2);
        goto LAB_0011d0d0;
      }
      uVar5 = uVar5 & 0xffff;
      type2 = (x2->high_low_container).typecodes[uVar5];
      c_00 = get_copy_of_container
                       ((x2->high_low_container).containers[uVar5],&type2,
                        (_Bool)((x2->high_low_container).flags & 1));
      if (((x2->high_low_container).flags & 1) != 0) {
        *(container_t **)((long)(x2->high_low_container).containers + lVar8 * 8 + local_48) = c_00;
        (x2->high_low_container).typecodes[lVar8 + local_40] = type2;
      }
      ra_insert_new_key_value_at(local_88,iVar10 + iVar2,key,c_00,type2);
      if ((int)local_38 + iVar2 == 0) {
        iVar4 = (int)local_70;
        iVar10 = (int)local_78 + iVar2 + 1;
        start_index = local_7c;
        goto LAB_0011d0f7;
      }
      key = (x2->high_low_container).keys[(ushort)((short)local_58 + (short)lVar8 + 1)];
      lVar8 = lVar8 + 1;
    }
    uVar9 = iVar10 + iVar2 & 0xffff;
    typecode = local_88->typecodes[uVar9];
    c = (undefined8 *)local_88->containers[uVar9];
    type1 = typecode;
    _Var3 = container_is_full(c,typecode);
    if (!_Var3) {
      if (((char)local_64 == '\0') || (typecode == '\x01')) {
LAB_0011cf94:
        c1 = (bitset_container_t *)get_writable_copy_if_shared(c,&type1);
      }
      else {
        c_01 = c;
        typecode_00 = typecode;
        if (typecode == '\x04') {
          typecode_00 = *(uint8_t *)(c + 1);
          if (typecode_00 == '\x01') goto LAB_0011cf94;
          c_01 = (undefined8 *)*c;
          type1 = typecode_00;
        }
        c1 = container_to_bitset(c_01,typecode_00);
        container_free(c,typecode);
        type1 = '\x01';
      }
      uVar5 = uVar5 & 0xffff;
      type2 = (x2->high_low_container).typecodes[uVar5];
      pbVar6 = (bitset_container_t *)
               container_lazy_ior(c1,type1,(x2->high_low_container).containers[uVar5],type2,
                                  &result_type);
      if (pbVar6 != c1) {
        container_free(c1,type1);
      }
      local_88->containers[(int)local_70 + lVar8] = pbVar6;
      local_88->typecodes[lVar8 + (int)local_70] = result_type;
    }
    iVar10 = (int)local_78;
    uVar5 = local_70 + lVar8 + 1;
    if ((iVar10 + iVar2 == (uint)uVar5) || (iVar2 + (int)local_60 + (int)local_58 == 0)) {
      start_index = (int)local_50 + iVar2 + 1;
      iVar4 = (int)local_70;
      iVar10 = iVar10 + iVar2;
LAB_0011d0f7:
      if (iVar4 + iVar2 + 1 != iVar10) {
        return;
      }
LAB_0011d101:
      ra_append_copy_range
                (local_88,&x2->high_low_container,start_index,local_7c,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    local_50 = local_58 + lVar8 + 1;
    puVar7 = (ushort *)((ulong)(((uint)uVar5 & 0xffff) * 2) + (long)local_88->keys);
    key = (x2->high_low_container).keys[(uint)local_50 & 0xffff];
LAB_0011d0d0:
    uVar9 = iVar10 + iVar2;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)) {
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    container_lazy_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}